

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_homedir(char *buffer,size_t *size)

{
  size_t sVar1;
  int r;
  size_t len;
  uv_passwd_t pwd;
  size_t *size_local;
  char *buffer_local;
  
  pwd.homedir = (char *)size;
  buffer_local._4_4_ = uv_os_getenv("HOME",buffer,size);
  if ((buffer_local._4_4_ == -2) &&
     (buffer_local._4_4_ = uv_os_get_passwd((uv_passwd_t *)&len), buffer_local._4_4_ == 0)) {
    sVar1 = strlen(pwd.shell);
    if (sVar1 < *(ulong *)pwd.homedir) {
      memcpy(buffer,pwd.shell,sVar1 + 1);
      *(size_t *)pwd.homedir = sVar1;
      uv_os_free_passwd((uv_passwd_t *)&len);
      buffer_local._4_4_ = 0;
    }
    else {
      *(size_t *)pwd.homedir = sVar1 + 1;
      uv_os_free_passwd((uv_passwd_t *)&len);
      buffer_local._4_4_ = -0x69;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_os_homedir(char* buffer, size_t* size) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Check if the HOME environment variable is set first. The task of
     performing input validation on buffer and size is taken care of by
     uv_os_getenv(). */
  r = uv_os_getenv("HOME", buffer, size);

  if (r != UV_ENOENT)
    return r;

  /* HOME is not set, so call uv_os_get_passwd() */
  r = uv_os_get_passwd(&pwd);

  if (r != 0) {
    return r;
  }

  len = strlen(pwd.homedir);

  if (len >= *size) {
    *size = len + 1;
    uv_os_free_passwd(&pwd);
    return UV_ENOBUFS;
  }

  memcpy(buffer, pwd.homedir, len + 1);
  *size = len;
  uv_os_free_passwd(&pwd);

  return 0;
}